

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_object_impl.hpp
# Opt level: O3

void __thiscall
asio::detail::
io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
::io_object_impl<asio::io_context>
          (io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
           *this,io_context *context,type *param_2)

{
  service_type *psVar1;
  key local_20;
  
  local_20.type_info_ =
       (type_info *)&typeid_wrapper<asio::detail::reactive_socket_service<asio::ip::tcp>>::typeinfo;
  local_20.id_ = (id *)0x0;
  psVar1 = (service_type *)
           service_registry::do_use_service
                     ((context->super_execution_context).service_registry_,&local_20,
                      service_registry::
                      create<asio::detail::reactive_socket_service<asio::ip::tcp>,asio::io_context>,
                      context);
  this->service_ = psVar1;
  (this->implementation_).protocol_.family_ = 2;
  (this->executor_).super_any_executor_base.target_fns_ =
       (target_fns *)
       execution::detail::any_executor_base::
       target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value,void>::type*)
       ::fns_with_execute;
  (this->executor_).super_any_executor_base.object_fns_ =
       (object_fns *)
       execution::detail::any_executor_base::
       object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,std::shared_ptr<void>>::value),void>::type*)
       ::fns;
  (this->executor_).super_any_executor_base.object_.__align =
       (anon_struct_8_0_00000001_for___align)context;
  *(undefined4 *)((long)&(this->executor_).super_any_executor_base.object_ + 0xc) = 0;
  (this->executor_).super_any_executor_base.target_ = &this->executor_;
  (this->executor_).prop_fns_ =
       (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)execution::
          any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
          ::prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>()::fns;
  (this->implementation_).super_base_implementation_type.socket_ = -1;
  (this->implementation_).super_base_implementation_type.state_ = '\0';
  return;
}

Assistant:

explicit io_object_impl(ExecutionContext& context,
      typename enable_if<is_convertible<
        ExecutionContext&, execution_context&>::value>::type* = 0)
    : service_(&asio::use_service<IoObjectService>(context)),
      executor_(context.get_executor())
  {
    service_->construct(implementation_);
  }